

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::getDualsDoubletonEquation(HPresolve *this,int row,int col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  ostream *poVar16;
  int in_ESI;
  int iVar17;
  long in_RDI;
  double dVar18;
  double extraout_XMM0_Qa;
  vector<double,_std::allocator<double>_> *extraout_XMM0_Qa_00;
  double up;
  double lo;
  int kk;
  int nzy;
  double valueX;
  double akx;
  double aky;
  double b;
  int y;
  double cy;
  double lby;
  double uby;
  double cxOld;
  double lbxOld;
  double ubxOld;
  double cxNew;
  double lbxNew;
  double ubxNew;
  int x;
  vector<double,_std::allocator<double>_> v;
  pair<int,_std::vector<double,_std::allocator<double>_>_> p;
  type in_stack_fffffffffffffd68;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffd70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffda8;
  HPresolve *in_stack_fffffffffffffdb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc0;
  double in_stack_fffffffffffffdc8;
  value_type vVar19;
  double in_stack_fffffffffffffdd0;
  double *in_stack_fffffffffffffdd8;
  double *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  HPresolve *in_stack_fffffffffffffdf0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe08;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe10;
  int local_d8;
  vector<double,_std::allocator<double>_> local_58 [3];
  int local_c;
  
  local_c = in_ESI;
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::top((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1a9941);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::pair
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::pop((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1a995e);
  std::get<1ul,int,std::vector<double,std::allocator<double>>>
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a996d);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::get<0ul,int,std::vector<double,std::allocator<double>>>
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a998c);
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,1);
  dVar1 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,0);
  dVar2 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,2);
  dVar18 = *pvVar13;
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::top((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1a9a0d);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::operator=
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::pop((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1a9a42);
  std::get<1ul,int,std::vector<double,std::allocator<double>>>
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a9a51);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,1);
  dVar3 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,0);
  dVar4 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,2);
  dVar5 = *pvVar13;
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::top((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1a9adb);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::operator=
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::pop((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1a9b10);
  std::get<1ul,int,std::vector<double,std::allocator<double>>>
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1a9b1f);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,1);
  dVar6 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,0);
  dVar7 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_58,2);
  dVar8 = *pvVar13;
  pvVar14 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                      ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1a9bb7);
  dVar9 = *pvVar14;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1a9bea);
  pvVar14 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                      ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1a9c00);
  dVar10 = *pvVar14;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1a9c33);
  pvVar14 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                      ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1a9c49);
  dVar11 = *pvVar14;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1a9c7c);
  pvVar13 = std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  dVar12 = *pvVar13;
  pvVar13 = std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *pvVar13 = (dVar9 - dVar11 * dVar12) / dVar10;
  pvVar13 = std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *(double *)(in_RDI + 2000) =
       *(double *)(in_RDI + 2000) + dVar8 * *pvVar13 + (dVar5 * dVar12 - dVar18 * dVar12);
  pvVar13 = std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *pvVar13 = dVar5;
  std::vector<int,_std::allocator<int>_>::at
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
             (size_type)in_stack_fffffffffffffd68);
  std::vector<int,_std::allocator<int>_>::at
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
             (size_type)in_stack_fffffffffffffd68);
  pvVar15 = std::vector<int,_std::allocator<int>_>::at
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  local_d8 = *pvVar15;
  while( true ) {
    pvVar15 = std::vector<int,_std::allocator<int>_>::at
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                         (size_type)in_stack_fffffffffffffd68);
    iVar17 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    if (*pvVar15 <= local_d8) break;
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
               (size_type)in_stack_fffffffffffffd68);
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
               (size_type)in_stack_fffffffffffffd68);
    local_d8 = local_d8 + 1;
  }
  getBoundOnLByZj(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                  (int)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8
                  ,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  getBoundOnLByZj(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                  (int)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8
                  ,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  if (*(double *)(in_RDI + 0xae8) <= -2e+200 && *(double *)(in_RDI + 0xae8) != -2e+200) {
    poVar16 = std::operator<<((ostream *)&std::cout,"PR: Error in postsolving doubleton equation ");
    poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_c);
    std::operator<<(poVar16," : inconsistent bounds for it\'s dual value.\n");
  }
  pvVar13 = std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *pvVar13 = 0.0;
  pvVar15 = std::vector<int,_std::allocator<int>_>::at
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *pvVar15 = 1;
  dVar18 = getColumnDualPost(in_stack_fffffffffffffdb0,iVar17);
  pvVar13 = std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *pvVar13 = dVar18;
  dVar18 = getColumnDualPost(in_stack_fffffffffffffdb0,iVar17);
  pvVar13 = std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *pvVar13 = dVar18;
  if (*(int *)(in_RDI + 0x7cc) == 1) {
    pvVar13 = std::vector<double,_std::allocator<double>_>::at
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                         (size_type)in_stack_fffffffffffffd68);
    vVar19 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::at
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                         (size_type)in_stack_fffffffffffffd68);
    *pvVar13 = vVar19;
  }
  pvVar15 = std::vector<int,_std::allocator<int>_>::at
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  if ((((*pvVar15 == 1) && (dVar12 == dVar1)) && (dVar1 < dVar3)) ||
     (((pvVar15 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                             (size_type)in_stack_fffffffffffffd68), *pvVar15 == 1 &&
       (dVar12 == dVar2)) && (dVar4 < dVar2)))) {
    pvVar15 = std::vector<int,_std::allocator<int>_>::at
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                         (size_type)in_stack_fffffffffffffd68);
    *pvVar15 = 0;
  }
  else {
    iVar17 = (int)in_RDI + 0x1b0;
    pvVar13 = std::vector<double,_std::allocator<double>_>::at
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                         (size_type)in_stack_fffffffffffffd68);
    if (*(double *)(in_RDI + 0xae8) <= *pvVar13 - dVar7 &&
        *pvVar13 - dVar7 != *(double *)(in_RDI + 0xae8)) {
      iVar17 = (int)in_RDI + 0x1b0;
      pvVar13 = std::vector<double,_std::allocator<double>_>::at
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd70,
                           (size_type)in_stack_fffffffffffffd68);
      if (*(double *)(in_RDI + 0xae8) <= dVar6 - *pvVar13 &&
          dVar6 - *pvVar13 != *(double *)(in_RDI + 0xae8)) {
        pvVar15 = std::vector<int,_std::allocator<int>_>::at
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                             (size_type)in_stack_fffffffffffffd68);
        *pvVar15 = 0;
        goto LAB_001aa5f8;
      }
    }
    std::abs(iVar17);
    if ((extraout_XMM0_Qa < *(double *)(in_RDI + 0xae8)) ||
       (std::abs(iVar17), in_stack_fffffffffffffd80 = extraout_XMM0_Qa_00,
       (double)extraout_XMM0_Qa_00 < *(double *)(in_RDI + 0xae8))) {
      pvVar15 = std::vector<int,_std::allocator<int>_>::at
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                           (size_type)in_stack_fffffffffffffd68);
      *pvVar15 = 0;
    }
    else {
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                           (long)(*(int *)(in_RDI + 0xc) + local_c));
      *pvVar15 = 0;
    }
  }
LAB_001aa5f8:
  pvVar15 = std::vector<int,_std::allocator<int>_>::at
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
                       (size_type)in_stack_fffffffffffffd68);
  *pvVar15 = 1;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1aa640);
  return;
}

Assistant:

void HPresolve::getDualsDoubletonEquation(int row, int col) {
	// colDual already set. need valuePrimal from stack. maybe change rowDual depending on bounds. old bounds kept in oldBounds.
	// variables j,k : we eliminated col(k)(c.col) and are left with changed bounds on j and no row.
	//                               y                                                 x

	pair< int ,vector<double> > p = oldBounds.top(); oldBounds.pop();
	vector<double> v = get<1>(p);
	int x = get<0>(p);
	double ubxNew = v[1];
	double lbxNew = v[0];
	double cxNew = v[2];
	p = oldBounds.top(); oldBounds.pop();
	v = get<1>(p);
	double ubxOld = v[1];
	double lbxOld = v[0];
	double cxOld = v[2];
	p = oldBounds.top(); oldBounds.pop();
	v = get<1>(p);
	double uby = v[1];
	double lby = v[0];
	double cy = v[2];

	int y = col;

	double b = postValue.top(); postValue.pop();
	double aky = postValue.top(); postValue.pop();
	double akx = postValue.top(); postValue.pop();
	double valueX = valuePrimal.at(x);

	// primal value and objective shift
	valuePrimal.at(y) = (b - akx*valueX)/aky;
	objShift += -cxNew*valueX + cxOld*valueX + cy*valuePrimal.at(y);

	//column cost of x
	colCostAtEl.at(x) = cxOld;


	//get nzCol.at(y) before unflag row as missing
	int nzy = Aend.at(y) - Astart.at(y);
	for (int kk=Astart.at(y); kk<Aend.at(y); ++kk)
		if (!flagRow.at(Aindex.at(kk)))
			nzy--;


	double lo = -HSOL_CONST_INF;
	double up = HSOL_CONST_INF;

	getBoundOnLByZj(row, x, &lo, &up, lbxOld, ubxOld);
	getBoundOnLByZj(row, y, &lo, &up, lby,    uby);

		//calculate yi
	if (lo-up > tol)
		cout<<"PR: Error in postsolving doubleton equation "<<row <<" : inconsistent bounds for it's dual value.\n";

	if (lo<=0 && up>=0) {
		valueRowDual.at(row) = 0;
	}
	else if (lo>0) {
		valueRowDual.at(row) = lo;
	}
	else if (up<0) {
		valueRowDual.at(row) = up;
	}

	flagRow.at(row) = 1;
	valueColDual.at(y) = getColumnDualPost(y);
	valueColDual.at(x) = getColumnDualPost(x);

	if (iKKTcheck == 1)
		chk.colDual.at(x) = valueColDual.at(x);

	if ((nonbasicFlag.at(x) == 1 && valueX==ubxNew && ubxNew < ubxOld)  ||
		(nonbasicFlag.at(x) == 1 && valueX==lbxNew && lbxNew > lbxOld))   {
			nonbasicFlag.at(x) = 0;
	}
	else {
		//row becomes basic unless y is between bounds, in which case y is basic
		if (valuePrimal.at(y) - lby > tol  && uby - valuePrimal.at(y) > tol) {
			nonbasicFlag.at(y) = 0;
		}
		else if (abs(valueX-ubxNew ) < tol || abs(valueX-lbxNew ) < tol)
			nonbasicFlag.at(y) = 0;
		else
			nonbasicFlag[numColOriginal + row] = 0;
	}

	//flagRow.at(row) = true;
	flagCol.at(y) = 1;
}